

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall FIX::ScreenLog::onOutgoing(ScreenLog *this,string *value)

{
  ostream *poVar1;
  int in_ECX;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->m_outgoing == true) {
    Mutex::lock((Mutex *)s_mutex);
    UtcTimeStamp::setCurrent(&this->m_time);
    poVar1 = std::operator<<((ostream *)&std::cout,"<");
    UtcTimeStampConvertor::convert_abi_cxx11_
              (&local_40,(UtcTimeStampConvertor *)&this->m_time,(UtcTimeStamp *)0x9,in_ECX);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_prefix);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,"outgoing>");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"  (");
    std::__cxx11::string::string((string *)&local_80,(string *)value);
    replaceSOHWithPipe(&local_60,&local_80);
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    poVar1 = std::operator<<(poVar1,")");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    Mutex::unlock((Mutex *)s_mutex);
  }
  return;
}

Assistant:

void onOutgoing(const std::string &value) override {
    if (!m_outgoing) {
      return;
    }
    Locker l(s_mutex);
    m_time.setCurrent();
    std::cout << "<" << UtcTimeStampConvertor::convert(m_time, 9) << ", " << m_prefix << ", " << "outgoing>"
              << std::endl
              << "  (" << replaceSOHWithPipe(value) << ")" << std::endl;
  }